

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

int yang_check_version(lys_module *module,lys_submodule *submodule,char *value,int repeat)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  LY_ECODE ecode;
  ly_ctx *ctx;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  bool bVar7;
  
  if (repeat == 0) {
    if ((*value == '1') && (value[1] == '\0')) {
      if (submodule == (lys_submodule *)0x0) {
        uVar2 = *(ushort *)&module->field_0x40 & 0xfff1 | 2;
LAB_001518fb:
        *(ushort *)&module->field_0x40 = uVar2;
        uVar6 = 0;
        goto LAB_00151877;
      }
      bVar7 = (*(ushort *)&module->field_0x40 & 0xc) == 0;
      if (!bVar7) {
        ly_vlog(module->ctx,LYE_INVER,LY_VLOG_NONE,(void *)0x0);
      }
      bVar1 = submodule->field_0x40 & 0xf1 | 2;
    }
    else {
      iVar3 = strcmp(value,"1.1");
      if (iVar3 != 0) {
        ctx = module->ctx;
        pcVar5 = "yang-version";
        ecode = LYE_INARG;
        pcVar4 = value;
        goto LAB_0015186a;
      }
      if (submodule == (lys_submodule *)0x0) {
        uVar2 = *(ushort *)&module->field_0x40 & 0xfff1 | 4;
        goto LAB_001518fb;
      }
      bVar7 = (*(ushort *)&module->field_0x40 & 0xe) == 4;
      if (!bVar7) {
        ly_vlog(module->ctx,LYE_INVER,LY_VLOG_NONE,(void *)0x0);
      }
      bVar1 = submodule->field_0x40 & 0xf1 | 4;
    }
    uVar6 = (uint)!bVar7;
    submodule->field_0x40 = bVar1;
  }
  else {
    ctx = module->ctx;
    pcVar5 = "module";
    ecode = LYE_TOOMANY;
    pcVar4 = "yang version";
LAB_0015186a:
    ly_vlog(ctx,ecode,LY_VLOG_NONE,(void *)0x0,pcVar4,pcVar5);
    uVar6 = 1;
  }
LAB_00151877:
  free(value);
  return uVar6;
}

Assistant:

int
yang_check_version(struct lys_module *module, struct lys_submodule *submodule, char *value, int repeat)
{
    int ret = EXIT_SUCCESS;

    if (repeat) {
        LOGVAL(module->ctx, LYE_TOOMANY, LY_VLOG_NONE, NULL, "yang version", "module");
        ret = EXIT_FAILURE;
    } else {
        if (!strcmp(value, "1")) {
            if (submodule) {
                if (module->version > 1) {
                    LOGVAL(module->ctx, LYE_INVER, LY_VLOG_NONE, NULL);
                    ret = EXIT_FAILURE;
                 }
                submodule->version = 1;
            } else {
                module->version = 1;
            }
        } else if (!strcmp(value, "1.1")) {
            if (submodule) {
                if (module->version != 2) {
                    LOGVAL(module->ctx, LYE_INVER, LY_VLOG_NONE, NULL);
                    ret = EXIT_FAILURE;
                }
                submodule->version = 2;
            } else {
                module->version = 2;
            }
        } else {
            LOGVAL(module->ctx, LYE_INARG, LY_VLOG_NONE, NULL, value, "yang-version");
            ret = EXIT_FAILURE;
        }
    }
    free(value);
    return ret;
}